

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O1

uint8_t * __thiscall
cdns::dump_block(cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version
                ,int *err,FILE *F_out)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int64_t iVar4;
  byte *in_00;
  uint uVar5;
  int64_t val;
  int local_4c;
  char *p_out;
  int64_t local_40;
  cdns *local_38;
  
  bVar2 = *in;
  local_4c = cdns_version;
  local_38 = this;
  in_00 = cbor_get_number(in,in_max,&val);
  if (bVar2 >> 5 == 4 && in_00 != (byte *)0x0) {
    fwrite("    [\n",6,1,(FILE *)F_out);
    iVar4 = val;
    if (val == -1) {
      val = 0xffffffff;
    }
    lVar1 = val;
    if (((in_00 < in_max) && (in_00 != (byte *)0x0)) && (0 < val)) {
      local_40 = iVar4;
      uVar5 = 0;
      while (*in_00 != 0xff) {
        if ((*in_00 & 0xe0) == 0xa0) {
          in_00 = dump_block_properties(local_38,in_00,in_max,out_buf,out_max,local_4c,err,F_out);
        }
        else {
          uVar5 = uVar5 + 1;
          p_out = out_buf;
          fprintf((FILE *)F_out,"        -- Property %d:\n    ",(ulong)uVar5);
          in_00 = cbor_to_text(in_00,in_max,&p_out,out_max,err);
          fwrite(out_buf,1,(long)p_out - (long)out_buf,(FILE *)F_out);
          fputc(10,(FILE *)F_out);
        }
        lVar1 = val + -1;
        if (((in_max <= in_00) || (in_00 == (byte *)0x0)) || (bVar3 = val < 2, val = lVar1, bVar3))
        goto LAB_0017f38c;
      }
      fwrite("        --end of array",0x16,1,(FILE *)F_out);
      if (local_40 == -1) {
        in_00 = in_00 + 1;
        lVar1 = val;
      }
      else {
        fwrite("        Error, end of array mark unexpected.\n",0x2d,1,(FILE *)F_out);
        *err = -3;
        in_00 = (byte *)0x0;
        lVar1 = val;
      }
    }
LAB_0017f38c:
    val = lVar1;
    if (in_00 != (byte *)0x0) {
      fwrite("\n    ]\n",7,1,(FILE *)F_out);
    }
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,"   Error, cannot parse the first bytes of block, type=%d.\n",
            (ulong)(bVar2 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_ARRAY) {
        fprintf(F_out, "   Error, cannot parse the first bytes of block, type=%d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;

        fprintf(F_out, "    [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                int inner_type = CBOR_CLASS(*in);

                if (inner_type == CBOR_T_MAP) {
                    /* Records are held in a map */
                    in = dump_block_properties(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                }
                else {
                    p_out = out_buf;
                    rank++;
                    fprintf(F_out, "        -- Property %d:\n    ", rank);
                    in = cbor_to_text(in, in_max, &p_out, out_max, err);
                    fwrite(out_buf, 1, p_out - out_buf, F_out);
                    fprintf(F_out, "\n");
                }
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n    ]\n");
        }

    }

    return in;
}